

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
          (DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash> *this)

{
  if (this->_entries != (Entry *)0x0) {
    Lib::free(this->_entries);
  }
  return;
}

Assistant:

~DHMap()
  {
    if(_entries) {
      ASS_EQ(_afterLast-_entries,_capacity);
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,_capacity*sizeof(Entry),"DHMap::Entry");
    }
  }